

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O0

Rectangle deqp::gls::LifetimeTests::details::randomViewport
                    (RenderContext *ctx,GLint maxWidth,GLint maxHeight,Random *rnd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  GLint yOff;
  GLint height;
  GLint xOff;
  GLint width;
  RenderTarget *target;
  Random *rnd_local;
  GLint maxHeight_local;
  GLint maxWidth_local;
  RenderContext *ctx_local;
  RenderTarget *this;
  
  iVar1 = (*ctx->_vptr_RenderContext[4])();
  this = (RenderTarget *)CONCAT44(extraout_var,iVar1);
  iVar1 = tcu::RenderTarget::getWidth(this);
  iVar1 = de::min<int>(iVar1,maxWidth);
  iVar2 = tcu::RenderTarget::getWidth(this);
  iVar2 = de::Random::getInt(rnd,0,iVar2 - iVar1);
  iVar3 = tcu::RenderTarget::getHeight(this);
  iVar3 = de::min<int>(iVar3,maxHeight);
  iVar4 = tcu::RenderTarget::getHeight(this);
  iVar4 = de::Random::getInt(rnd,0,iVar4 - iVar3);
  Rectangle::Rectangle((Rectangle *)&ctx_local,iVar2,iVar4,iVar1,iVar3);
  return _ctx_local;
}

Assistant:

Rectangle randomViewport (const RenderContext& ctx, GLint maxWidth, GLint maxHeight,
						  Random& rnd)
{
	const RenderTarget&	target	= ctx.getRenderTarget();
	const GLint			width	= de::min(target.getWidth(), maxWidth);
	const GLint			xOff	= rnd.getInt(0, target.getWidth() - width);
	const GLint			height	= de::min(target.getHeight(), maxHeight);
	const GLint			yOff	= rnd.getInt(0, target.getHeight() - height);

	return Rectangle(xOff, yOff, width, height);
}